

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O1

int pfx_table_remove_id(pfx_table *pfx_table,trie_node **root,trie_node *node,rtr_socket *socket,
                       uint level)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  long lVar5;
  node_data *data;
  rtr_socket *prVar6;
  undefined8 uVar7;
  pfx_record pVar8;
  bool bVar9;
  int iVar10;
  trie_node *ptr;
  ulong uVar11;
  long in_FS_OFFSET;
  bool bVar12;
  int local_80;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined6 uStack_46;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    if (root == (trie_node **)0x0) {
      __assert_fail("root",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/pfx/trie/trie-pfx.c"
                    ,0x1d8,
                    "int pfx_table_remove_id(struct pfx_table *, struct trie_node **, struct trie_node *, const struct rtr_socket *, const unsigned int)"
                   );
    }
    if (*root == (trie_node *)0x0) {
      __assert_fail("*root",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/pfx/trie/trie-pfx.c"
                    ,0x1d9,
                    "int pfx_table_remove_id(struct pfx_table *, struct trie_node **, struct trie_node *, const struct rtr_socket *, const unsigned int)"
                   );
    }
    bVar9 = true;
    while (bVar9) {
      data = (node_data *)node->data;
      bVar12 = data->len != 0;
      if (bVar12) {
        uVar11 = 0;
        do {
          while ((data->len <= uVar11 || (data->ary[uVar11].socket != socket))) {
            uVar11 = uVar11 + 1;
            bVar12 = uVar11 < data->len;
            if (!bVar12) goto LAB_0010860f;
          }
          uVar3 = data->ary[uVar11].asn;
          uVar4 = (node->prefix).u.addr6.addr[3];
          uVar7 = *(undefined8 *)((long)&(node->prefix).u + 4);
          uStack_5c = (undefined4)*(undefined8 *)&node->prefix;
          uStack_58 = (undefined4)((ulong)*(undefined8 *)&node->prefix >> 0x20);
          uStack_54 = (undefined4)uVar7;
          uStack_50 = (undefined4)((ulong)uVar7 >> 0x20);
          uVar1 = node->len;
          uVar2 = data->ary[uVar11].max_len;
          prVar6 = data->ary[uVar11].socket;
          iVar10 = pfx_table_del_elem(data,(uint)uVar11);
          if (iVar10 == -1) {
            local_80 = -1;
          }
          else if (pfx_table->update_fp != (pfx_update_fp)0x0) {
            pVar8.prefix.ver = uStack_5c;
            pVar8.asn = uVar3;
            pVar8.prefix.u.addr6.addr[1] = uStack_54;
            pVar8.prefix.u.addr6.addr[0] = uStack_58;
            pVar8.prefix.u.addr6.addr[3] = uVar4;
            pVar8.prefix.u.addr6.addr[2] = uStack_50;
            pVar8.max_len = uVar2;
            pVar8.min_len = uVar1;
            pVar8._26_6_ = uStack_46;
            pVar8.socket = prVar6;
            (*pfx_table->update_fp)(pfx_table,pVar8,false);
          }
        } while (iVar10 != -1);
      }
LAB_0010860f:
      if (bVar12) {
        bVar12 = false;
      }
      else if (data->len == 0) {
        ptr = trie_remove(node,&node->prefix,node->len,level);
        if (ptr == (trie_node *)0x0) {
          __assert_fail("rm_node",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/pfx/trie/trie-pfx.c"
                        ,0x1ed,
                        "int pfx_table_remove_id(struct pfx_table *, struct trie_node **, struct trie_node *, const struct rtr_socket *, const unsigned int)"
                       );
        }
        if (*ptr->data != 0) {
          __assert_fail("((struct node_data *)rm_node->data)->len == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/pfx/trie/trie-pfx.c"
                        ,0x1ee,
                        "int pfx_table_remove_id(struct pfx_table *, struct trie_node **, struct trie_node *, const struct rtr_socket *, const unsigned int)"
                       );
        }
        lrtr_free(ptr->data);
        lrtr_free(ptr);
        if (ptr == *root) {
          *root = (trie_node *)0x0;
          bVar12 = false;
          local_80 = 0;
        }
        else {
          bVar12 = ptr != node;
          if (!bVar12) {
            local_80 = 0;
          }
        }
      }
      else {
        bVar12 = true;
        bVar9 = false;
      }
      if (!bVar12) goto LAB_001086fd;
    }
    if ((node->lchild != (trie_node *)0x0) &&
       (iVar10 = pfx_table_remove_id(pfx_table,root,node->lchild,socket,level + 1), iVar10 == -1)) {
      local_80 = -1;
LAB_001086fd:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
        return local_80;
      }
      __stack_chk_fail();
    }
    node = node->rchild;
    if (node == (trie_node *)0x0) {
      local_80 = 0;
      goto LAB_001086fd;
    }
    level = level + 1;
  } while( true );
}

Assistant:

int pfx_table_remove_id(struct pfx_table *pfx_table, struct trie_node **root, struct trie_node *node,
			const struct rtr_socket *socket, const unsigned int level)
{
	assert(node);
	assert(root);
	assert(*root);
	bool check_node = true;

	while (check_node) {
		// data from removed node are replaced from data from child nodes (if children exists),
		// same node must be checked again if it was replaced with previous child node data
		struct node_data *data = node->data;

		for (unsigned int i = 0; i < data->len; i++) {
			while (data->len > i && data->ary[i].socket == socket) {
				struct pfx_record record = {data->ary[i].asn, node->prefix, node->len,
							    data->ary[i].max_len, data->ary[i].socket};
				if (pfx_table_del_elem(data, i) == PFX_ERROR)
					return PFX_ERROR;
				pfx_table_notify_clients(pfx_table, &record, false);
			}
		}
		if (data->len == 0) {
			struct trie_node *rm_node = trie_remove(node, &(node->prefix), node->len, level);

			assert(rm_node);
			assert(((struct node_data *)rm_node->data)->len == 0);
			lrtr_free(((struct node_data *)rm_node->data));
			lrtr_free(rm_node);

			if (rm_node == *root) {
				*root = NULL;
				return PFX_SUCCESS;
			} else if (rm_node == node) {
				return PFX_SUCCESS;
			}
		} else {
			check_node = false;
		}
	}

	if (node->lchild) {
		if (pfx_table_remove_id(pfx_table, root, node->lchild, socket, level + 1) == PFX_ERROR)
			return PFX_ERROR;
	}
	if (node->rchild)
		return pfx_table_remove_id(pfx_table, root, node->rchild, socket, level + 1);
	return PFX_SUCCESS;
}